

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O2

void __thiscall Float_ExponentCannotBeEmpty_Test::TestBody(Float_ExponentCannotBeEmpty_Test *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"1e",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"1e+",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"1e-",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(Float, ExponentCannotBeEmpty) {
    test_error("1e");
    test_error("1e+");
    test_error("1e-");
}